

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CURLcode cw_chunked_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  Curl_cwriter *data_00;
  char *pcVar1;
  size_t local_50;
  size_t consumed;
  void *pvStack_40;
  CURLcode result;
  chunked_writer *ctx;
  size_t blen_local;
  char *buf_local;
  Curl_cwriter *pCStack_20;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  pvStack_40 = writer->ctx;
  ctx = (chunked_writer *)blen;
  blen_local = (size_t)buf;
  buf_local._4_4_ = type;
  pCStack_20 = writer;
  writer_local = (Curl_cwriter *)data;
  if ((type & 1U) == 0) {
    data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,buf,blen);
  }
  else {
    local_50 = 0;
    consumed._4_4_ =
         httpchunk_readwrite(data,(Curl_chunker *)((long)pvStack_40 + 0x20),writer->next,buf,blen,
                             &local_50);
    data_00 = writer_local;
    if (consumed._4_4_ == CURLE_OK) {
      ctx = (chunked_writer *)((long)ctx - local_50);
      if (*(int *)((long)pvStack_40 + 0x28) == 8) {
        *(uint *)((long)&writer_local[0xc].next + 1) =
             *(uint *)((long)&writer_local[0xc].next + 1) & 0xfffffff7 | 8;
        if ((((ctx != (chunked_writer *)0x0) && (writer_local != (Curl_cwriter *)0x0)) &&
            ((*(ulong *)((long)&writer_local[0x51].next + 4) >> 0x1e & 1) != 0)) &&
           ((writer_local[0x98].ctx == (void *)0x0 ||
            (0 < *(int *)((long)writer_local[0x98].ctx + 8))))) {
          Curl_infof((Curl_easy *)writer_local,"Leftovers after chunking: %zu bytes",ctx);
        }
      }
      else if (((buf_local._4_4_ & 0x80) != 0) &&
              ((*(uint *)((long)&writer_local[0xc].next + 1) >> 0x11 & 1) == 0)) {
        Curl_failf((Curl_easy *)writer_local,"transfer closed with outstanding read data remaining")
        ;
        return CURLE_PARTIAL_FILE;
      }
      data_local._4_4_ = CURLE_OK;
    }
    else {
      if (*(int *)((long)pvStack_40 + 0x2c) == 6) {
        Curl_failf((Curl_easy *)writer_local,"Failed reading the chunked-encoded stream");
      }
      else {
        pcVar1 = Curl_chunked_strerror(*(CHUNKcode *)((long)pvStack_40 + 0x2c));
        Curl_failf((Curl_easy *)data_00,"%s in chunked-encoding",pcVar1);
      }
      data_local._4_4_ = consumed._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cw_chunked_write(struct Curl_easy *data,
                                 struct Curl_cwriter *writer, int type,
                                 const char *buf, size_t blen)
{
  struct chunked_writer *ctx = writer->ctx;
  CURLcode result;
  size_t consumed;

  if(!(type & CLIENTWRITE_BODY))
    return Curl_cwriter_write(data, writer->next, type, buf, blen);

  consumed = 0;
  result = httpchunk_readwrite(data, &ctx->ch, writer->next, buf, blen,
                               &consumed);

  if(result) {
    if(CHUNKE_PASSTHRU_ERROR == ctx->ch.last_code) {
      failf(data, "Failed reading the chunked-encoded stream");
    }
    else {
      failf(data, "%s in chunked-encoding",
            Curl_chunked_strerror(ctx->ch.last_code));
    }
    return result;
  }

  blen -= consumed;
  if(CHUNK_DONE == ctx->ch.state) {
    /* chunks read successfully, download is complete */
    data->req.download_done = TRUE;
    if(blen) {
      infof(data, "Leftovers after chunking: %zu bytes", blen);
    }
  }
  else if((type & CLIENTWRITE_EOS) && !data->req.no_body) {
    failf(data, "transfer closed with outstanding read data remaining");
    return CURLE_PARTIAL_FILE;
  }

  return CURLE_OK;
}